

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O0

void md5_update_uv_s16(com_md5_t *md5,void *buf_t,u32 len,int offset)

{
  uint uVar1;
  undefined4 uStack_14068;
  u8 t [81960];
  uint local_38;
  u32 j;
  u32 part_len;
  u32 idx;
  u32 i;
  u8 *buf;
  int offset_local;
  u32 len_local;
  void *buf_t_local;
  com_md5_t *md5_local;
  
  j = md5->bits[0] >> 3 & 0x3f;
  uVar1 = len * 2;
  for (local_38 = 0; local_38 < uVar1; local_38 = local_38 + 2) {
    *(undefined1 *)((long)&uStack_14068 + (ulong)local_38) =
         *(undefined1 *)((long)buf_t + (ulong)local_38 + (long)offset);
    *(undefined1 *)((long)&uStack_14068 + (ulong)(local_38 + 1)) = 0;
  }
  md5->bits[0] = len * 0x10 + md5->bits[0];
  if (md5->bits[0] < len << 4) {
    md5->bits[1] = md5->bits[1] + 1;
  }
  md5->bits[1] = (uVar1 >> 0x1d) + md5->bits[1];
  part_len = 0x40 - j;
  if (uVar1 < part_len) {
    part_len = 0;
  }
  else {
    memcpy(md5->msg + j,&uStack_14068,(ulong)part_len);
    com_md5_trans(md5->h,(u32 *)md5->msg);
    for (; part_len + 0x3f < uVar1; part_len = part_len + 0x40) {
      com_md5_trans(md5->h,(u32 *)((long)&uStack_14068 + (ulong)part_len));
    }
    j = 0;
  }
  if (uVar1 != part_len) {
    memcpy(md5->msg + j,(void *)((long)&uStack_14068 + (ulong)part_len),(ulong)(uVar1 - part_len));
  }
  return;
}

Assistant:

static void md5_update_uv_s16(com_md5_t *md5, void *buf_t, u32 len, int offset)
{
    u8 *buf;
    u32 i, idx, part_len, j;
    u8 t[8196 * 10];
    buf = (u8 *)buf_t + offset;
    idx = (u32)((md5->bits[0] >> 3) & 0x3f);
    len = len * 2;
    for (j = 0; j < len; j += 2) {
        t[j] = buf[j];
        t[j + 1] = 0;
    }
    md5->bits[0] += (len << 3);
    if (md5->bits[0] < (len << 3)) {
        (md5->bits[1])++;
    }
    md5->bits[1] += (len >> 29);
    part_len = 64 - idx;
    if (len >= part_len) {
        memcpy(md5->msg + idx, t, part_len);
        com_md5_trans(md5->h, (u32 *)md5->msg);
        for (i = part_len; i + 63 < len; i += 64) {
            com_md5_trans(md5->h, (u32 *)(t + i));
        }
        idx = 0;
    } else {
        i = 0;
    }
    if (len - i > 0) {
        memcpy(md5->msg + idx, t + i, len - i);
    }
}